

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall
wabt::TypeChecker::PopAndCheck2Types(TypeChecker *this,Type expected1,Type expected2,char *desc)

{
  Result RVar1;
  Result RVar2;
  Enum EVar3;
  bool bVar4;
  Type actual;
  Type local_38;
  
  local_38.enum_ = Any;
  local_38.type_index_ = 0;
  RVar1 = PeekType(this,0,&local_38);
  EVar3 = local_38.enum_;
  bVar4 = local_38 != expected2;
  local_38.enum_ = Any;
  local_38.type_index_ = 0;
  RVar2 = PeekType(this,1,&local_38);
  bVar4 = ((RVar2.enum_ == Error || RVar1.enum_ == Error) ||
          bVar4 && (EVar3 != Any && expected2.enum_ != Any)) ||
          local_38 != expected1 && (local_38.enum_ != Any && expected1.enum_ != Any);
  RVar1.enum_._1_3_ = 0;
  RVar1.enum_._0_1_ = bVar4;
  PrintStackIfFailed<wabt::Type,wabt::Type>(this,RVar1,desc,expected1,expected2);
  RVar1 = DropTypes(this,2);
  RVar2.enum_._1_3_ = 0;
  RVar2.enum_._0_1_ = bVar4 || RVar1.enum_ == Error;
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::PopAndCheck2Types(Type expected1,
                                      Type expected2,
                                      const char* desc) {
  Result result = Result::Ok;
  result |= PeekAndCheckType(0, expected2);
  result |= PeekAndCheckType(1, expected1);
  PrintStackIfFailed(result, desc, expected1, expected2);
  result |= DropTypes(2);
  return result;
}